

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

int GetBinIdForEntropy(uint64_t min,uint64_t max,uint64_t val)

{
  long lVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint64_t delta;
  uint64_t range;
  uint64_t val_local;
  uint64_t max_local;
  uint64_t min_local;
  undefined4 local_4;
  
  lVar1 = max - min;
  if (lVar1 == 0) {
    local_4 = 0;
  }
  else {
    lVar2 = val - min;
    auVar3._8_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar3._0_8_ = lVar2;
    auVar3._12_4_ = 0x45300000;
    auVar4._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar4._0_8_ = lVar1;
    auVar4._12_4_ = 0x45300000;
    local_4 = (int)((((auVar3._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) * 3.999999) /
                   ((auVar4._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)));
  }
  return local_4;
}

Assistant:

static int GetBinIdForEntropy(uint64_t min, uint64_t max, uint64_t val) {
  const uint64_t range = max - min;
  if (range > 0) {
    const uint64_t delta = val - min;
    return (int)((NUM_PARTITIONS - 1e-6) * delta / range);
  } else {
    return 0;
  }
}